

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

SmallVector<bool,_8UL> * __thiscall
spirv_cross::SmallVector<bool,_8UL>::operator=
          (SmallVector<bool,_8UL> *this,SmallVector<bool,_8UL> *other)

{
  size_t sVar1;
  bool *pbVar2;
  bool *pbVar3;
  size_t sVar4;
  
  if (this != other) {
    (this->super_VectorView<bool>).buffer_size = 0;
    reserve(this,(other->super_VectorView<bool>).buffer_size);
    sVar1 = (other->super_VectorView<bool>).buffer_size;
    if (sVar1 != 0) {
      pbVar2 = (this->super_VectorView<bool>).ptr;
      pbVar3 = (other->super_VectorView<bool>).ptr;
      sVar4 = 0;
      do {
        pbVar2[sVar4] = pbVar3[sVar4];
        sVar4 = sVar4 + 1;
      } while (sVar1 != sVar4);
    }
    (this->super_VectorView<bool>).buffer_size = sVar1;
  }
  return this;
}

Assistant:

SmallVector &operator=(const SmallVector &other) SPIRV_CROSS_NOEXCEPT
	{
		if (this == &other)
			return *this;

		clear();
		reserve(other.buffer_size);
		for (size_t i = 0; i < other.buffer_size; i++)
			new (&this->ptr[i]) T(other.ptr[i]);
		this->buffer_size = other.buffer_size;
		return *this;
	}